

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeRename(sqlite3_vtab *pVtab,char *zNewName)

{
  char *pcVar1;
  sqlite3_callback unaff_RBX;
  char **in_RSI;
  void *in_RDI;
  char *unaff_retaddr;
  sqlite3 *in_stack_00000008;
  char *zSql;
  int rc;
  Rtree *pRtree;
  int local_24;
  
  local_24 = 7;
  pcVar1 = sqlite3_mprintf("ALTER TABLE %Q.\'%q_node\'   RENAME TO \"%w_node\";ALTER TABLE %Q.\'%q_parent\' RENAME TO \"%w_parent\";ALTER TABLE %Q.\'%q_rowid\'  RENAME TO \"%w_rowid\";"
                           ,*(undefined8 *)((long)in_RDI + 0x30),
                           *(undefined8 *)((long)in_RDI + 0x38),in_RSI,
                           *(undefined8 *)((long)in_RDI + 0x30),*(undefined8 *)((long)in_RDI + 0x38)
                          );
  if (pcVar1 != (char *)0x0) {
    local_24 = sqlite3_exec(in_stack_00000008,unaff_retaddr,unaff_RBX,in_RDI,in_RSI);
    sqlite3_free((void *)0x1d2f40);
  }
  return local_24;
}

Assistant:

static int rtreeRename(sqlite3_vtab *pVtab, const char *zNewName){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_NOMEM;
  char *zSql = sqlite3_mprintf(
    "ALTER TABLE %Q.'%q_node'   RENAME TO \"%w_node\";"
    "ALTER TABLE %Q.'%q_parent' RENAME TO \"%w_parent\";"
    "ALTER TABLE %Q.'%q_rowid'  RENAME TO \"%w_rowid\";"
    , pRtree->zDb, pRtree->zName, zNewName 
    , pRtree->zDb, pRtree->zName, zNewName 
    , pRtree->zDb, pRtree->zName, zNewName
  );
  if( zSql ){
    rc = sqlite3_exec(pRtree->db, zSql, 0, 0, 0);
    sqlite3_free(zSql);
  }
  return rc;
}